

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseData<float>::resolve<float_const&>(PromiseData<float> *this,float *value)

{
  __shared_ptr<float,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::make_shared<float,float_const&>((float *)&local_20);
  std::__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2> *)&this->m_value,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  PromiseDataBase<float,_void_(const_float_&)>::setSettled
            (&this->super_PromiseDataBase<float,_void_(const_float_&)>);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }